

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

LY_ERR ly_ctx_unset_options(ly_ctx *ctx,uint16_t option)

{
  lysc_ext_instance *plVar1;
  lysc_ext_substmt *plVar2;
  ulong uVar3;
  void *pvVar4;
  void **ppvVar5;
  uint uVar6;
  void *pvVar7;
  char *pcVar8;
  lysc_node *root;
  void **ppvVar9;
  lys_module *mod;
  
  if (ctx == (ly_ctx *)0x0) {
    pcVar8 = "ctx";
    ctx = (ly_ctx *)0x0;
  }
  else {
    if ((option & 4) == 0) {
      if (((option >> 10 & 1) != 0) && ((ctx->flags & 0x400) != 0)) {
        lyht_free(ctx->leafref_links_ht,ly_ctx_ht_leafref_links_rec_free);
        ctx->leafref_links_ht = (ly_ht *)0x0;
      }
      if (((option & 0x40) != 0) && ((ctx->flags & 0x40) != 0)) {
        uVar6 = 0;
        while( true ) {
          if (uVar6 < (ctx->list).count) {
            uVar3 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            mod = (lys_module *)(ctx->list).field_2.dnodes[uVar3];
          }
          else {
            mod = (lys_module *)0x0;
          }
          if (mod == (lys_module *)0x0) break;
          if (mod->compiled != (lysc_module *)0x0) {
            lysc_module_dfs_full(mod,lysc_node_clear_priv_dfs_cb,(void *)0x0);
            pvVar7 = (void *)0x0;
            while( true ) {
              plVar1 = mod->compiled->exts;
              if (plVar1 == (lysc_ext_instance *)0x0) {
                pvVar4 = (void *)0x0;
              }
              else {
                pvVar4 = plVar1[-1].compiled;
              }
              if (pvVar4 <= pvVar7) break;
              ppvVar9 = (void **)0x0;
              while( true ) {
                plVar2 = plVar1[(long)pvVar7].substmts;
                if (plVar2 == (lysc_ext_substmt *)0x0) {
                  ppvVar5 = (void **)0x0;
                }
                else {
                  ppvVar5 = plVar2[-1].storage_p;
                }
                if (ppvVar5 <= ppvVar9) break;
                if ((plVar2[(long)ppvVar9].stmt &
                    (LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_CONTAINER|LY_STMT_CHOICE|
                     LY_STMT_CASE|LY_STMT_ANYXML|LY_STMT_ANYDATA)) != LY_STMT_NONE) {
                  for (root = (lysc_node *)*plVar2[(long)ppvVar9].storage_p;
                      root != (lysc_node *)0x0; root = root->next) {
                    lysc_tree_dfs_full(root,lysc_node_clear_priv_dfs_cb,(void *)0x0);
                  }
                }
                ppvVar9 = (void **)((long)ppvVar9 + 1);
              }
              pvVar7 = (void *)((long)pvVar7 + 1);
            }
          }
        }
      }
      ctx->flags = ctx->flags & ~option;
      return LY_SUCCESS;
    }
    pcVar8 = "option";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar8,"ly_ctx_unset_options");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_options(struct ly_ctx *ctx, uint16_t option)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const struct lysc_ext_instance *ext;
    struct lysc_node *root;

    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);
    LY_CHECK_ERR_RET(option & LY_CTX_NO_YANGLIBRARY, LOGARG(ctx, option), LY_EINVAL);

    if ((ctx->flags & LY_CTX_LEAFREF_LINKING) && (option & LY_CTX_LEAFREF_LINKING)) {
        lyht_free(ctx->leafref_links_ht, ly_ctx_ht_leafref_links_rec_free);
        ctx->leafref_links_ht = NULL;
    }

    if ((ctx->flags & LY_CTX_SET_PRIV_PARSED) && (option & LY_CTX_SET_PRIV_PARSED)) {
        struct lys_module *mod;
        uint32_t index;

        index = 0;
        while ((mod = ly_ctx_get_module_iter(ctx, &index))) {
            if (!mod->compiled) {
                continue;
            }

            /* set NULL for all ::lysc_node.priv pointers in module */
            lysc_module_dfs_full(mod, lysc_node_clear_priv_dfs_cb, NULL);

            /* set NULL for all ::lysc_node.priv pointers in compiled extension instances */
            LY_ARRAY_FOR(mod->compiled->exts, u) {
                ext = &mod->compiled->exts[u];
                LY_ARRAY_FOR(ext->substmts, v) {
                    if (ext->substmts[v].stmt & LY_STMT_DATA_NODE_MASK) {
                        LY_LIST_FOR(*ext->substmts[v].storage_p, root) {
                            lysc_tree_dfs_full(root, lysc_node_clear_priv_dfs_cb, NULL);
                        }
                    }
                }
            }
        }
    }

    /* unset the option(s) */
    ctx->flags &= ~option;

    return LY_SUCCESS;
}